

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Interface::SetOption(Interface *this,string *sParams)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  size_t nValue;
  string sName;
  string sParam;
  string local_360;
  stringstream sfail;
  ostream local_330 [376];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)sParams,_S_out|_S_in);
  sParam._M_dataplus._M_p = (pointer)&sParam.field_2;
  sParam._M_string_length = 0;
  sParam.field_2._M_local_buf[0] = '\0';
  sName._M_dataplus._M_p = (pointer)&sName.field_2;
  sName._M_string_length = 0;
  sName.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::operator>>((istream *)&ss,(string *)&sParam);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator==(&sParam,"name");
    if (bVar1) {
      std::operator>>((istream *)&ss,(string *)&sName);
    }
    else {
      bVar1 = std::operator==(&sParam,"value");
      if (bVar1) {
        std::istream::_M_extract<unsigned_long>((ulong *)&ss);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&sfail);
        poVar3 = std::operator<<(local_330,"Unrecognized SetOption parameter: ");
        std::operator<<(poVar3,(string *)&sParam);
        std::__cxx11::stringbuf::str();
        Notify(this,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sfail);
      }
    }
  }
  if (sName._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&sfail,"SetOption: Could not find name of the option to set",
               (allocator *)&local_360);
    Notify(this,(string *)&sfail);
    std::__cxx11::string::~string((string *)&sfail);
  }
  else {
    bVar1 = std::operator==(&sName,"Hash");
    if (bVar1) {
      (*s_pPositionHashTable->_vptr_PositionHashTable[6])(s_pPositionHashTable,0x100000);
    }
  }
  std::__cxx11::string::~string((string *)&sName);
  std::__cxx11::string::~string((string *)&sParam);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

INTERFACE_PROTOTYPE( SetOption )
    {
        stringstream ss( sParams );
        string sParam, sName;
        size_t nValue = 1;

        while ( ss >> sParam )
        {
            if ( sParam == "name" )
                ss >> sName;
            else if ( sParam == "value" )
                ss >> nValue;
            else
            {
                stringstream sfail;
                sfail << "Unrecognized SetOption parameter: " << sParam;
                Notify( sfail.str() );
            }
        }

        if ( !sName.empty() )
        {
            if ( sName == "Hash" )
                s_pPositionHashTable->SetSize( nValue * 1024 * 1024 );
        }
        else
            Notify( "SetOption: Could not find name of the option to set" );
    }